

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O1

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_func_by_c_str_Test<char16_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_func_by_c_str_Test<char16_t> *this)

{
  int iVar1;
  char *in_R9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sv_hash;
  vector<unsigned_long,_std::allocator<unsigned_long>_> s_hash;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> s;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> sv;
  AssertionResult iutest_ar;
  allocator<char> local_289;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_288;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_268;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_250;
  string local_230;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_210;
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0;
  undefined7 uStack_1ef;
  char local_1e0;
  AssertionHelper local_1d8;
  undefined1 local_1a8 [128];
  ios_base local_128 [264];
  
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::u16string::_M_construct<char16_t_const*>
            ((u16string *)&local_250,L"arikitari na_world!",L"");
  local_210._M_len = local_250._M_string_length;
  local_210._M_str = local_250._M_dataplus._M_p;
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_268,3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_288,3);
  local_1a8._0_8_ = L"_ ";
  local_1a8._8_8_ = &local_268;
  ::detail::
  operator|<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_const_char16_t_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:353:56),_true,_false,_nullptr>
            (&local_250,
             (split_helper_conv_func<const_char16_t_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:353:56),_false,_true,_false>
              *)local_1a8);
  local_1a8._0_8_ = L"_ ";
  local_1a8._8_8_ = &local_288;
  ::detail::
  operator|<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_const_char16_t_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:356:57),_true,_false,_nullptr>
            (&local_210,
             (split_helper_conv_func<const_char16_t_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:356:57),_false,_true,_false>
              *)local_1a8);
  if ((long)local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1e0 = true;
    }
    else {
      iVar1 = bcmp(local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      local_1e0 = iVar1 == 0;
    }
  }
  else {
    local_1e0 = false;
  }
  local_1f8 = 0;
  local_1f0 = 0;
  local_200 = &local_1f0;
  if ((bool)local_1e0 == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_230,(internal *)&local_200,
               (AssertionResult *)
               "std::equal(s_hash.begin(), s_hash.end(), sv_hash.begin(), sv_hash.end())","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,local_230._M_dataplus._M_p,&local_289);
    local_1d8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
    ;
    local_1d8.m_part_result.super_iuCodeMessage.m_line = 0x16a;
    local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
  }
  if (local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_last_by_stl_str)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(std::basic_string<char_type>(constant::space_underscore<char_type>())) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}